

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O1

double __thiscall chrono::fea::ChElementShellReissner4::GetDensity(ChElementShellReissner4 *this)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pLVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  pLVar4 = (this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_layers).
      super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
      ._M_impl.super__Vector_impl_data._M_finish == pLVar4) {
    dVar7 = 0.0;
  }
  else {
    auVar8 = ZEXT816(0);
    lVar6 = 0;
    uVar5 = 0;
    do {
      lVar3 = *(long *)((long)&(pLVar4->m_material).
                               super___shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar6);
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(pLVar4->m_material).
                         super___shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + lVar6);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      uVar1 = *(ulong *)(lVar3 + 0x38);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        auVar8._8_8_ = 0;
      }
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar1;
      pLVar4 = (this->m_layers).
               super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
               ._M_impl.super__Vector_impl_data._M_start;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)((long)&pLVar4->m_thickness + lVar6);
      auVar8 = vfmadd231sd_fma(auVar8,auVar9,auVar2);
      dVar7 = auVar8._0_8_;
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x28;
    } while (uVar5 < (ulong)(((long)(this->m_layers).
                                    super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar4 >> 3)
                            * -0x3333333333333333));
  }
  return dVar7 / this->tot_thickness;
}

Assistant:

double ChElementShellReissner4::GetDensity() {
    double tot_density = 0;
    for (size_t kl = 0; kl < m_layers.size(); kl++) {
        double rho = m_layers[kl].GetMaterial()->Get_rho();
        double layerthick = m_layers[kl].Get_thickness();
        tot_density += rho * layerthick;
    }
    return tot_density / tot_thickness;
}